

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O1

void __thiscall rcg::System::clearInterfaces(System *this)

{
  pointer psVar1;
  int in_ESI;
  long lVar2;
  ulong uVar3;
  
  psVar1 = (this->ilist).
           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ilist).
      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      Interface::close(*(Interface **)
                        ((long)&(psVar1->
                                super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr + lVar2),in_ESI);
      uVar3 = uVar3 + 1;
      psVar1 = (this->ilist).
               super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)((long)(this->ilist).
                                   super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4));
  }
  std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
  clear(&this->ilist);
  return;
}

Assistant:

void System::clearInterfaces()
{
  // close and clear all interfaces as part of ENUM-WORKAROUND
  for (size_t i=0; i<ilist.size(); i++)
  {
    ilist[i]->close();
  }

  ilist.clear();
}